

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O0

bool __thiscall tinyusdz::Stage::add_root_prim(Stage *this,Prim *prim,bool rename_prim_name)

{
  bool bVar1;
  string *psVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  reference pvVar5;
  size_type sVar6;
  ostream *poVar7;
  Value *pVVar8;
  Path *pPVar9;
  string local_e28 [39];
  allocator local_e01;
  string local_e00 [32];
  string local_de0;
  ostringstream local_dc0 [8];
  ostringstream ss_e_6;
  allocator local_c41;
  string local_c40;
  Path local_c20;
  string local_b50 [32];
  ostringstream local_b30 [8];
  ostringstream ss_e_5;
  string local_9b8 [39];
  allocator local_991;
  string local_990 [32];
  string local_970;
  ostringstream local_950 [8];
  ostringstream ss_e_4;
  undefined1 local_7d8 [8];
  string unique_name;
  string local_7b0 [32];
  ostringstream local_790 [8];
  ostringstream ss_e_3;
  string local_618 [32];
  ostringstream local_5f8 [8];
  ostringstream ss_e_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_480;
  size_t i;
  ostringstream local_458 [8];
  ostringstream ss_e_1;
  allocator local_2d9;
  string local_2d8;
  Path local_2b8;
  int local_1e4;
  string local_1e0 [32];
  ostringstream local_1c0 [8];
  ostringstream ss_e;
  undefined1 local_48 [8];
  string elementName;
  bool rename_prim_name_local;
  Prim *prim_local;
  Stage *this_local;
  
  elementName.field_2._M_local_buf[0xf] = rename_prim_name;
  psVar2 = Prim::element_name_abi_cxx11_(prim);
  std::__cxx11::string::string((string *)local_48,(string *)psVar2);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    if ((elementName.field_2._M_local_buf[0xf] & 1U) == 0) {
      std::__cxx11::ostringstream::ostringstream(local_458);
      poVar7 = std::operator<<((ostream *)local_458,"[error]");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                              );
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = std::operator<<(poVar7,"add_root_prim");
      poVar7 = std::operator<<(poVar7,"():");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x281);
      std::operator<<(poVar7," ");
      poVar7 = std::operator<<((ostream *)local_458,"Prim has empty elementName.");
      std::operator<<(poVar7,"\n");
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator+=((string *)&this->_err,(string *)&i);
      std::__cxx11::string::~string((string *)&i);
      this_local._7_1_ = 0;
      local_1e4 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_458);
      goto LAB_00241204;
    }
    std::__cxx11::string::operator=((string *)local_48,"default");
    pVVar8 = Prim::get_data(prim);
    bVar1 = SetPrimElementName(pVVar8,(string *)local_48);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_1c0);
      poVar7 = std::operator<<((ostream *)local_1c0,"[error]");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                              );
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = std::operator<<(poVar7,"add_root_prim");
      poVar7 = std::operator<<(poVar7,"():");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x27d);
      std::operator<<(poVar7," ");
      poVar7 = std::operator<<((ostream *)local_1c0,
                               "Internal error. cannot modify Prim\'s elementName");
      std::operator<<(poVar7,"\n");
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator+=((string *)&this->_err,local_1e0);
      std::__cxx11::string::~string(local_1e0);
      this_local._7_1_ = 0;
      local_1e4 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1c0);
      goto LAB_00241204;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2d8,"",&local_2d9);
    Path::Path(&local_2b8,(string *)local_48,&local_2d8);
    pPVar9 = Prim::element_path(prim);
    Path::operator=(pPVar9,&local_2b8);
    Path::~Path(&local_2b8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  }
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::size(&this->_root_nodes);
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::size(&this->_root_node_nameSet);
  if (pbVar4 != args) {
    std::
    multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->_root_node_nameSet);
    for (local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::size
                         (&this->_root_nodes), local_480 < args;
        local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &local_480->field_0x1) {
      pvVar5 = std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::operator[]
                         (&this->_root_nodes,(size_type)local_480);
      Prim::element_name_abi_cxx11_(pvVar5);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_5f8);
        poVar7 = std::operator<<((ostream *)local_5f8,"[error]");
        poVar7 = std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                                );
        poVar7 = std::operator<<(poVar7,":");
        poVar7 = std::operator<<(poVar7,"add_root_prim");
        poVar7 = std::operator<<(poVar7,"():");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x28a);
        std::operator<<(poVar7," ");
        poVar7 = std::operator<<((ostream *)local_5f8,
                                 "Internal error: Existing root Prim\'s elementName is empty.");
        std::operator<<(poVar7,"\n");
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator+=((string *)&this->_err,local_618);
        std::__cxx11::string::~string(local_618);
        this_local._7_1_ = 0;
        local_1e4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_5f8);
        goto LAB_00241204;
      }
      pvVar5 = std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::operator[]
                         (&this->_root_nodes,(size_type)local_480);
      psVar2 = Prim::element_name_abi_cxx11_(pvVar5);
      sVar6 = std::
              multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&this->_root_node_nameSet,psVar2);
      if (sVar6 != 0) {
        std::__cxx11::ostringstream::ostringstream(local_790);
        poVar7 = std::operator<<((ostream *)local_790,"[error]");
        poVar7 = std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                                );
        poVar7 = std::operator<<(poVar7,":");
        poVar7 = std::operator<<(poVar7,"add_root_prim");
        poVar7 = std::operator<<(poVar7,"():");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x28e);
        std::operator<<(poVar7," ");
        poVar7 = std::operator<<((ostream *)local_790,
                                 "Internal error: Stage contains root Prim with same elementName.");
        std::operator<<(poVar7,"\n");
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator+=((string *)&this->_err,local_7b0);
        std::__cxx11::string::~string(local_7b0);
        this_local._7_1_ = 0;
        local_1e4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_790);
        goto LAB_00241204;
      }
      pvVar5 = std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::operator[]
                         (&this->_root_nodes,(size_type)local_480);
      psVar2 = Prim::element_name_abi_cxx11_(pvVar5);
      unique_name.field_2._8_8_ =
           std::
           multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::insert(&this->_root_node_nameSet,psVar2);
    }
  }
  sVar6 = std::
          multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&this->_root_node_nameSet,(key_type *)local_48);
  if (sVar6 != 0) {
    if ((elementName.field_2._M_local_buf[0xf] & 1U) == 0) {
      std::__cxx11::ostringstream::ostringstream(local_dc0);
      poVar7 = std::operator<<((ostream *)local_dc0,"[error]");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                              );
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = std::operator<<(poVar7,"add_root_prim");
      poVar7 = std::operator<<(poVar7,"():");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x2a4);
      std::operator<<(poVar7," ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_e00,"Prim name(elementName) {} already exists in children.\n",&local_e01);
      psVar2 = Prim::element_name_abi_cxx11_(prim);
      fmt::format<std::__cxx11::string>(&local_de0,(fmt *)local_e00,psVar2,args);
      poVar7 = std::operator<<((ostream *)local_dc0,(string *)&local_de0);
      std::operator<<(poVar7,"\n");
      std::__cxx11::string::~string((string *)&local_de0);
      std::__cxx11::string::~string(local_e00);
      std::allocator<char>::~allocator((allocator<char> *)&local_e01);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator+=((string *)&this->_err,local_e28);
      std::__cxx11::string::~string(local_e28);
      this_local._7_1_ = 0;
      local_1e4 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_dc0);
      goto LAB_00241204;
    }
    std::__cxx11::string::string((string *)local_7d8);
    bVar1 = makeUniqueName(&this->_root_node_nameSet,(string *)local_48,(string *)local_7d8);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)local_48,(string *)local_7d8);
      pVVar8 = Prim::get_data(prim);
      bVar1 = SetPrimElementName(pVVar8,(string *)local_48);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_c40,"",&local_c41);
        Path::Path(&local_c20,(string *)local_48,&local_c40);
        pPVar9 = Prim::element_path(prim);
        Path::operator=(pPVar9,&local_c20);
        Path::~Path(&local_c20);
        std::__cxx11::string::~string((string *)&local_c40);
        std::allocator<char>::~allocator((allocator<char> *)&local_c41);
        local_1e4 = 0;
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_b30);
        poVar7 = std::operator<<((ostream *)local_b30,"[error]");
        poVar7 = std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                                );
        poVar7 = std::operator<<(poVar7,":");
        poVar7 = std::operator<<(poVar7,"add_root_prim");
        poVar7 = std::operator<<(poVar7,"():");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x2a0);
        std::operator<<(poVar7," ");
        poVar7 = std::operator<<((ostream *)local_b30,
                                 "Internal error. cannot modify Prim\'s elementName.");
        std::operator<<(poVar7,"\n");
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator+=((string *)&this->_err,local_b50);
        std::__cxx11::string::~string(local_b50);
        this_local._7_1_ = 0;
        local_1e4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_b30);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_950);
      poVar7 = std::operator<<((ostream *)local_950,"[error]");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                              );
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = std::operator<<(poVar7,"add_root_prim");
      poVar7 = std::operator<<(poVar7,"():");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x299);
      std::operator<<(poVar7," ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_990,"Internal error. cannot assign unique name for `{}`.\n",&local_991);
      fmt::format<std::__cxx11::string>(&local_970,(fmt *)local_990,(string *)local_48,args);
      poVar7 = std::operator<<((ostream *)local_950,(string *)&local_970);
      std::operator<<(poVar7,"\n");
      std::__cxx11::string::~string((string *)&local_970);
      std::__cxx11::string::~string(local_990);
      std::allocator<char>::~allocator((allocator<char> *)&local_991);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator+=((string *)&this->_err,local_9b8);
      std::__cxx11::string::~string(local_9b8);
      this_local._7_1_ = 0;
      local_1e4 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_950);
    }
    std::__cxx11::string::~string((string *)local_7d8);
    if (local_1e4 != 0) goto LAB_00241204;
  }
  std::
  multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(&this->_root_node_nameSet,(value_type *)local_48);
  std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::emplace_back<tinyusdz::Prim>
            (&this->_root_nodes,prim);
  this->_dirty = true;
  this_local._7_1_ = 1;
  local_1e4 = 1;
LAB_00241204:
  std::__cxx11::string::~string((string *)local_48);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Stage::add_root_prim(Prim &&prim, bool rename_prim_name) {

#if defined(TINYUSDZ_ENABLE_THREAD)
  // TODO: Only take a lock when dirty.
  std::lock_guard<std::mutex> lock(_mutex);
#endif


  std::string elementName = prim.element_name();

  if (elementName.empty()) {
    if (rename_prim_name) {

      // assign default name `default`
      elementName = "default";

      if (!SetPrimElementName(prim.get_data(), elementName)) {
        PUSH_ERROR_AND_RETURN("Internal error. cannot modify Prim's elementName");
      }
      prim.element_path() = Path(elementName, /* prop_part */"");
    } else {
      PUSH_ERROR_AND_RETURN("Prim has empty elementName.");
    }
  }

  if (_root_nodes.size() != _root_node_nameSet.size()) {
    // Rebuild nameSet
    _root_node_nameSet.clear();
    for (size_t i = 0; i < _root_nodes.size(); i++) {
      if (_root_nodes[i].element_name().empty()) {
        PUSH_ERROR_AND_RETURN("Internal error: Existing root Prim's elementName is empty.");
      }

      if (_root_node_nameSet.count(_root_nodes[i].element_name())) {
        PUSH_ERROR_AND_RETURN("Internal error: Stage contains root Prim with same elementName.");
      }

      _root_node_nameSet.insert(_root_nodes[i].element_name());
    }
  }

  if (_root_node_nameSet.count(elementName)) {
    if (rename_prim_name) {
      std::string unique_name;
      if (!makeUniqueName(_root_node_nameSet, elementName, &unique_name)) {
        PUSH_ERROR_AND_RETURN(fmt::format("Internal error. cannot assign unique name for `{}`.\n", elementName));
      }

      elementName = unique_name;

      // Need to modify both Prim::data::name and Prim::elementPath
      if (!SetPrimElementName(prim.get_data(), elementName)) {
        PUSH_ERROR_AND_RETURN("Internal error. cannot modify Prim's elementName.");
      }
      prim.element_path() = Path(elementName, /* prop_part */"");
    } else {
      PUSH_ERROR_AND_RETURN(fmt::format("Prim name(elementName) {} already exists in children.\n", prim.element_name()));
    }
  }


  _root_node_nameSet.insert(elementName);
  _root_nodes.emplace_back(std::move(prim));

  _dirty = true;

  return true;


}